

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBufferOffsetQueryCase::iterate
          (TextureBufferOffsetQueryCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_151;
  GLuint texture;
  string local_148;
  GLuint buffer;
  string local_120;
  CallLogWrapper gl;
  GLuint texture_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ScopedLogSection section;
  string local_98;
  code *local_78;
  GLenum local_70;
  ResultCollector result;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
    if (!bVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_texture_buffer is not supported",
                 "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
                 ,0x19f);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148," // ERROR: ",(allocator<char> *)&local_120);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"NonBuffer",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Non-buffer",(allocator<char> *)&local_e0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_148,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_148);
  glu::CallLogWrapper::glGenTextures(&gl,1,&texture);
  glu::CallLogWrapper::glBindTexture(&gl,0xde1,texture);
  glu::CallLogWrapper::glTexStorage2D(&gl,0xde1,1,0x8058,0x20,0x20);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Got Error ",(allocator<char> *)&texture_1);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_c0,&local_e0,&local_98);
    std::operator+(&local_120,&local_c0,": ");
    std::operator+(&local_148,&local_120,"gen texture");
    tcu::ResultCollector::fail(&result,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  deqp::gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&result,&gl,0xde1,0,0x919d,0,this->m_type);
  glu::CallLogWrapper::glDeleteTextures(&gl,1,&texture);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Buffer",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Texture buffer",(allocator<char> *)&local_e0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_148,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_148);
  glu::CallLogWrapper::glGenTextures(&gl,1,&texture_1);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c2a,texture_1);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Got Error ",(allocator<char> *)&texture);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_c0,&local_e0,&local_98);
    std::operator+(&local_120,&local_c0,": ");
    std::operator+(&local_148,&local_120,"bind texture");
    tcu::ResultCollector::fail(&result,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  glu::CallLogWrapper::glGenBuffers(&gl,1,&buffer);
  glu::CallLogWrapper::glBindBuffer(&gl,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData(&gl,0x8c2a,0x400,(void *)0x0,0x88e4);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Got Error ",(allocator<char> *)&texture);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_c0,&local_e0,&local_98);
    std::operator+(&local_120,&local_c0,": ");
    std::operator+(&local_148,&local_120,"bind buf");
    tcu::ResultCollector::fail(&result,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Offset0",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Offset 0",(allocator<char> *)&local_e0);
  tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&texture,pTVar1,&local_148,&local_120)
  ;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_148);
  glu::CallLogWrapper::glTexBuffer(&gl,0x8c2a,0x8236,buffer);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Got Error ",&local_151);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_c0,&local_e0,&local_98);
    std::operator+(&local_120,&local_c0,": ");
    std::operator+(&local_148,&local_120,"tex buffer");
    tcu::ResultCollector::fail(&result,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  deqp::gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&result,&gl,0x8c2a,0,0x919d,0,this->m_type);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&texture);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Offset256",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Offset 256",(allocator<char> *)&local_e0);
  tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&texture,pTVar1,&local_148,&local_120)
  ;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_148);
  glu::CallLogWrapper::glTexBufferRange(&gl,0x8c2a,0x8236,buffer,0x100,0x200);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Got Error ",&local_151);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_c0,&local_e0,&local_98);
    std::operator+(&local_120,&local_c0,": ");
    std::operator+(&local_148,&local_120,"tex buffer");
    tcu::ResultCollector::fail(&result,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  deqp::gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&result,&gl,0x8c2a,0,0x919d,0x100,this->m_type);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&texture);
  glu::CallLogWrapper::glDeleteTextures(&gl,1,&texture_1);
  glu::CallLogWrapper::glDeleteBuffers(&gl,1,&buffer);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

TextureBufferOffsetQueryCase::IterateResult TextureBufferOffsetQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// non-buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "NonBuffer", "Non-buffer");

		glw::GLuint	texture;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_2D, texture);
		gl.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 32, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "gen texture");

		verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_2D, 0, GL_TEXTURE_BUFFER_OFFSET, 0, m_type);

		gl.glDeleteTextures(1, &texture);
	}

	// buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Buffer", "Texture buffer");

		glw::GLuint	texture;
		glw::GLuint	buffer;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_BUFFER, texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind texture");

		gl.glGenBuffers(1, &buffer);
		gl.glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		gl.glBufferData(GL_TEXTURE_BUFFER, 1024, DE_NULL, GL_STATIC_DRAW);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind buf");

		{
			const tcu::ScopedLogSection subsection(m_testCtx.getLog(), "Offset0", "Offset 0");
			gl.glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "tex buffer");

			verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_BUFFER, 0, GL_TEXTURE_BUFFER_OFFSET, 0, m_type);
		}
		{
			const tcu::ScopedLogSection subsection(m_testCtx.getLog(), "Offset256", "Offset 256");
			gl.glTexBufferRange(GL_TEXTURE_BUFFER, GL_R32UI, buffer, 256, 512);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "tex buffer");

			verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_BUFFER, 0, GL_TEXTURE_BUFFER_OFFSET, 256, m_type);
		}

		gl.glDeleteTextures(1, &texture);
		gl.glDeleteBuffers(1, &buffer);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}